

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Flatten_x86::forward(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  byte bVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  size_t _elemsize;
  Mat local_78;
  
  iVar23 = bottom_blob->elempack;
  if (((long)iVar23 != 0) && (((int)bottom_blob->elemsize << 3) / iVar23 == 8)) {
    iVar23 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar23;
  }
  uVar3 = bottom_blob->dims;
  if (uVar3 == 1) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    iVar27 = bottom_blob->w;
    lVar38 = (long)iVar27;
    uVar4 = bottom_blob->h;
    uVar5 = bottom_blob->c;
    iVar37 = uVar4 * iVar27 * bottom_blob->d;
    uVar30 = uVar5 * iVar23 * iVar37;
    bVar31 = (uVar30 & 3) == 0 & opt->use_packing_layout;
    _elemsize = bottom_blob->elemsize / (ulong)(long)iVar23 << bVar31 * '\x02';
    if (bVar31 == 0) {
      iVar23 = Flatten::forward((Flatten *)
                                ((long)&this->_vptr_Flatten_x86 + (long)this->_vptr_Flatten_x86[-3])
                                ,bottom_blob,top_blob,opt);
      return iVar23;
    }
    iVar33 = (int)uVar30 >> 2;
    if (iVar23 == 1 && (uVar3 ^ 2) == 0) {
      Mat::operator=(top_blob,bottom_blob);
      top_blob->dims = 1;
      top_blob->w = iVar33;
      top_blob->h = 1;
      top_blob->cstep = (long)iVar33;
      top_blob->elemsize = _elemsize;
      top_blob->elempack = 4;
    }
    else {
      Mat::create(top_blob,iVar33,_elemsize,4,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (iVar23 == 4 && (uVar3 ^ 2) == 0) {
        uVar28 = 0;
        uVar25 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar25 = uVar28;
        }
        lVar36 = lVar38 * 0xc;
        lVar32 = lVar38 * 0x10;
        lVar34 = lVar38 * 8;
        lVar38 = lVar38 * 4;
        for (uVar35 = 0; uVar35 != uVar25; uVar35 = uVar35 + 1) {
          iVar33 = (int)uVar28;
          pvVar6 = top_blob->data;
          lVar24 = bottom_blob->elemsize * uVar35 * (long)bottom_blob->w;
          pvVar7 = bottom_blob->data;
          lVar29 = 0;
          for (iVar26 = 0; iVar26 + 3 < iVar27; iVar26 = iVar26 + 4) {
            puVar1 = (undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24);
            uVar8 = puVar1[1];
            uVar9 = puVar1[2];
            uVar10 = puVar1[3];
            puVar2 = (undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24 + 0x10);
            uVar11 = *puVar2;
            uVar12 = puVar2[1];
            uVar13 = puVar2[2];
            uVar14 = puVar2[3];
            puVar2 = (undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24 + 0x20);
            uVar15 = *puVar2;
            uVar16 = puVar2[1];
            uVar17 = puVar2[2];
            uVar18 = puVar2[3];
            puVar2 = (undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24 + 0x30);
            uVar19 = *puVar2;
            uVar20 = puVar2[1];
            uVar21 = puVar2[2];
            uVar22 = puVar2[3];
            puVar2 = (undefined4 *)((long)pvVar6 + lVar29 + (long)iVar33 * 4);
            *puVar2 = *puVar1;
            puVar2[1] = uVar11;
            puVar2[2] = uVar15;
            puVar2[3] = uVar19;
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + lVar38);
            *puVar1 = uVar8;
            puVar1[1] = uVar12;
            puVar1[2] = uVar16;
            puVar1[3] = uVar20;
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + lVar34);
            *puVar1 = uVar9;
            puVar1[1] = uVar13;
            puVar1[2] = uVar17;
            puVar1[3] = uVar21;
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + lVar36);
            *puVar1 = uVar10;
            puVar1[1] = uVar14;
            puVar1[2] = uVar18;
            puVar1[3] = uVar22;
            lVar29 = lVar29 + 0x10;
          }
          for (; iVar26 < iVar27; iVar26 = iVar26 + 1) {
            *(undefined4 *)((long)pvVar6 + lVar29 + (long)iVar33 * 4) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24);
            *(undefined4 *)((long)pvVar6 + lVar29 + lVar38) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24 + 4);
            *(undefined4 *)((long)pvVar6 + lVar29 + lVar34) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24 + 8);
            *(undefined4 *)((long)pvVar6 + lVar29 + lVar36) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4 + lVar24 + 0xc);
            lVar29 = lVar29 + 4;
          }
          lVar36 = lVar36 + lVar32;
          lVar34 = lVar34 + lVar32;
          lVar38 = lVar38 + lVar32;
          uVar28 = (ulong)(uint)(iVar33 + iVar27 * 4);
        }
      }
      if (1 < uVar3 - 3) {
        return 0;
      }
      lVar38 = (long)iVar37;
      if (iVar23 == 4) {
        iVar27 = 0;
        uVar25 = 0;
        if (0 < (int)uVar5) {
          uVar25 = (ulong)uVar5;
        }
        lVar34 = lVar38 * 4;
        lVar36 = lVar38 * 0x10;
        lVar32 = lVar38 * 8;
        lVar24 = lVar38 * 0xc;
        for (uVar28 = 0; uVar28 != uVar25; uVar28 = uVar28 + 1) {
          Mat::channel(&local_78,bottom_blob,(int)uVar28);
          pvVar7 = local_78.data;
          Mat::~Mat(&local_78);
          pvVar6 = top_blob->data;
          lVar29 = 0;
          for (iVar33 = 0; iVar33 + 3 < iVar37; iVar33 = iVar33 + 4) {
            puVar2 = (undefined4 *)((long)pvVar7 + lVar29 * 4);
            uVar8 = puVar2[1];
            uVar9 = puVar2[2];
            uVar10 = puVar2[3];
            puVar1 = (undefined4 *)((long)pvVar7 + lVar29 * 4 + 0x10);
            uVar11 = *puVar1;
            uVar12 = puVar1[1];
            uVar13 = puVar1[2];
            uVar14 = puVar1[3];
            puVar1 = (undefined4 *)((long)pvVar7 + lVar29 * 4 + 0x20);
            uVar15 = *puVar1;
            uVar16 = puVar1[1];
            uVar17 = puVar1[2];
            uVar18 = puVar1[3];
            puVar1 = (undefined4 *)((long)pvVar7 + lVar29 * 4 + 0x30);
            uVar19 = *puVar1;
            uVar20 = puVar1[1];
            uVar21 = puVar1[2];
            uVar22 = puVar1[3];
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + (long)iVar27 * 4);
            *puVar1 = *puVar2;
            puVar1[1] = uVar11;
            puVar1[2] = uVar15;
            puVar1[3] = uVar19;
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + lVar34);
            *puVar1 = uVar8;
            puVar1[1] = uVar12;
            puVar1[2] = uVar16;
            puVar1[3] = uVar20;
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + lVar32);
            *puVar1 = uVar9;
            puVar1[1] = uVar13;
            puVar1[2] = uVar17;
            puVar1[3] = uVar21;
            puVar1 = (undefined4 *)((long)pvVar6 + lVar29 + lVar24);
            *puVar1 = uVar10;
            puVar1[1] = uVar14;
            puVar1[2] = uVar18;
            puVar1[3] = uVar22;
            lVar29 = lVar29 + 0x10;
          }
          for (; iVar33 < iVar37; iVar33 = iVar33 + 1) {
            *(undefined4 *)((long)pvVar6 + lVar29 + (long)iVar27 * 4) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4);
            *(undefined4 *)((long)pvVar6 + lVar29 + lVar34) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4 + 4);
            *(undefined4 *)((long)pvVar6 + lVar29 + lVar32) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4 + 8);
            *(undefined4 *)((long)pvVar6 + lVar29 + lVar24) =
                 *(undefined4 *)((long)pvVar7 + lVar29 * 4 + 0xc);
            lVar29 = lVar29 + 4;
          }
          iVar27 = iVar27 + iVar37 * 4;
          lVar34 = lVar34 + lVar36;
          lVar32 = lVar32 + lVar36;
          lVar24 = lVar24 + lVar36;
        }
      }
      if (iVar23 != 1) {
        return 0;
      }
      if (iVar37 < 1) {
        iVar37 = 0;
      }
      uVar25 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar25 = 0;
      }
      lVar34 = 0;
      for (uVar28 = 0; uVar28 != uVar25; uVar28 = uVar28 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar28);
        pvVar7 = local_78.data;
        Mat::~Mat(&local_78);
        pvVar6 = top_blob->data;
        for (lVar32 = 0; iVar37 != (int)lVar32; lVar32 = lVar32 + 1) {
          *(undefined4 *)((long)pvVar6 + lVar32 * 4 + lVar34) =
               *(undefined4 *)((long)pvVar7 + lVar32 * 4);
        }
        lVar34 = lVar34 + lVar38 * 4;
      }
    }
  }
  return 0;
}

Assistant:

int Flatten_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}